

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  bool bVar1;
  char *str;
  Int32 IVar2;
  ostream *poVar3;
  long in_FS_OFFSET;
  Int32 result;
  string env_var;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff88;
  Int32 local_6c;
  string local_68;
  char *local_48 [4];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  FlagToEnvVar_abi_cxx11_((char *)in_stack_ffffffffffffff88.ptr_);
  str = getenv(local_48[0]);
  IVar2 = default_value;
  if (str != (char *)0x0) {
    local_6c = default_value;
    Message::Message((Message *)&local_68);
    poVar3 = (ostream *)(local_68._M_dataplus._M_p + 0x10);
    std::operator<<(poVar3,"Environment variable ");
    std::operator<<(poVar3,(string *)local_48);
    bVar1 = ParseInt32((Message *)&local_68,str,&local_6c);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
    IVar2 = local_6c;
    if (!bVar1) {
      Message::Message((Message *)&stack0xffffffffffffff88);
      std::ostream::operator<<(in_stack_ffffffffffffff88.ptr_ + 0x10,default_value);
      StringStreamToString(&local_68,in_stack_ffffffffffffff88.ptr_);
      printf("The default value %s is used.\n",local_68._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_68);
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffff88);
      fflush(_stdout);
      IVar2 = default_value;
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return IVar2;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
#if defined(GTEST_GET_INT32_FROM_ENV_)
  return GTEST_GET_INT32_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
#endif  // defined(GTEST_GET_INT32_FROM_ENV_)
}